

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O3

int __thiscall spdlog::details::file_helper::open(file_helper *this,char *__file,int __oflag,...)

{
  bool bVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  int *piVar4;
  size_type *psVar5;
  int iVar6;
  FILE *tmp;
  filename_t local_e8;
  int local_c4;
  filename_t *local_c0;
  FILE **local_b8;
  filename_t local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  filename_t local_70;
  string local_50;
  
  local_c4 = __oflag;
  if ((FILE *)this->fd_ != (FILE *)0x0) {
    fclose((FILE *)this->fd_);
    this->fd_ = (FILE *)0x0;
  }
  local_c0 = &this->filename_;
  local_b8 = &this->fd_;
  std::__cxx11::string::_M_assign((string *)local_c0);
  if (0 < this->open_tries_) {
    iVar6 = 0;
    do {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,*(long *)__file,*(long *)(__file + 8) + *(long *)__file);
      os::dir_name(&local_70,&local_b0);
      os::create_dir(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((char)local_c4 == '\0') {
LAB_00135122:
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ab","");
        bVar1 = os::fopen_s(local_b8,(filename_t *)__file,&local_e8);
        paVar2 = &local_e8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar2) {
          operator_delete(local_e8._M_dataplus._M_p);
          paVar2 = extraout_RAX;
        }
        if (!bVar1) {
          return (int)paVar2;
        }
        os::sleep_for_millis(this->open_interval_);
      }
      else {
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"wb","");
        bVar1 = os::fopen_s((FILE **)&local_90,(filename_t *)__file,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if (!bVar1) {
          fclose((FILE *)local_90._M_dataplus._M_p);
          goto LAB_00135122;
        }
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->open_tries_);
  }
  os::filename_to_str(&local_50,local_c0);
  std::operator+(&local_90,"Failed opening file ",&local_50);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_e8._M_dataplus._M_p = (pointer)*plVar3;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_e8._M_dataplus._M_p == psVar5) {
    local_e8.field_2._M_allocated_capacity = *psVar5;
    local_e8.field_2._8_8_ = plVar3[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar5;
  }
  local_e8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  piVar4 = __errno_location();
  throw_spdlog_ex(&local_e8,*piVar4);
}

Assistant:

SPDLOG_INLINE void file_helper::open(const filename_t &fname, bool truncate)
{
    close();
    filename_ = fname;

    auto *mode = SPDLOG_FILENAME_T("ab");
    auto *trunc_mode = SPDLOG_FILENAME_T("wb");

    for (int tries = 0; tries < open_tries_; ++tries)
    {
        // create containing folder if not exists already.
        os::create_dir(os::dir_name(fname));
        if (truncate)
        {
            // Truncate by opening-and-closing a tmp file in "wb" mode, always
            // opening the actual log-we-write-to in "ab" mode, since that
            // interacts more politely with eternal processes that might
            // rotate/truncate the file underneath us.
            std::FILE *tmp;
            if (os::fopen_s(&tmp, fname, trunc_mode))
            {
                continue;
            }
            std::fclose(tmp);
        }
        if (!os::fopen_s(&fd_, fname, mode))
        {
            return;
        }

        details::os::sleep_for_millis(open_interval_);
    }

    throw_spdlog_ex("Failed opening file " + os::filename_to_str(filename_) + " for writing", errno);
}